

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O0

void t21(void)

{
  int iVar1;
  undefined8 uVar2;
  _Bool ok_7;
  _Bool ok_6;
  _Bool ok_5;
  _Bool ok_4;
  _Bool ok_3;
  _Bool ok_2;
  _Bool ok_1;
  _Bool ok;
  ALLEGRO_USTR *us;
  ALLEGRO_USTR_INFO info;
  undefined1 local_10 [16];
  
  uVar2 = al_ref_buffer(local_10,"",1);
  iVar1 = al_ustr_get(uVar2,0);
  if (iVar1 == 0) {
    log_printf("OK   %s\n","al_ustr_get(us, 0) == 0");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get(us, 0) == 0");
    error = error + 1;
  }
  uVar2 = al_ref_cstr(local_10,"\x7f");
  iVar1 = al_ustr_get(uVar2,0);
  if (iVar1 == 0x7f) {
    log_printf("OK   %s\n","al_ustr_get(us, 0) == 0x7f");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get(us, 0) == 0x7f");
    error = error + 1;
  }
  uVar2 = al_ref_cstr(local_10,anon_var_dwarf_6a5);
  iVar1 = al_ustr_get(uVar2,0);
  if (iVar1 == 0x80) {
    log_printf("OK   %s\n","al_ustr_get(us, 0) == 0x80");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get(us, 0) == 0x80");
    error = error + 1;
  }
  uVar2 = al_ref_cstr(local_10,anon_var_dwarf_6d2);
  iVar1 = al_ustr_get(uVar2,0);
  if (iVar1 == 0x7ff) {
    log_printf("OK   %s\n","al_ustr_get(us, 0) == 0x7ff");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get(us, 0) == 0x7ff");
    error = error + 1;
  }
  uVar2 = al_ref_cstr(local_10,anon_var_dwarf_6f3);
  iVar1 = al_ustr_get(uVar2,0);
  if (iVar1 == 0x800) {
    log_printf("OK   %s\n","al_ustr_get(us, 0) == 0x800");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get(us, 0) == 0x800");
    error = error + 1;
  }
  uVar2 = al_ref_cstr(local_10,anon_var_dwarf_714);
  iVar1 = al_ustr_get(uVar2,0);
  if (iVar1 == 0xffff) {
    log_printf("OK   %s\n","al_ustr_get(us, 0) == 0xffff");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get(us, 0) == 0xffff");
    error = error + 1;
  }
  uVar2 = al_ref_cstr(local_10,anon_var_dwarf_735);
  iVar1 = al_ustr_get(uVar2,0);
  if (iVar1 == 0x10000) {
    log_printf("OK   %s\n","al_ustr_get(us, 0) == 0x010000");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get(us, 0) == 0x010000");
    error = error + 1;
  }
  uVar2 = al_ref_cstr(local_10,anon_var_dwarf_a3e + 6);
  iVar1 = al_ustr_get(uVar2,0);
  if (iVar1 == 0x10ffff) {
    log_printf("OK   %s\n","al_ustr_get(us, 0) == 0x10ffff");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get(us, 0) == 0x10ffff");
    error = error + 1;
  }
  return;
}

Assistant:

static void t21(void)
{
   ALLEGRO_USTR_INFO info;
   const ALLEGRO_USTR *us;

   us = al_ref_buffer(&info, "", 1);
   CHECK(al_ustr_get(us, 0) == 0);

   us = al_ref_cstr(&info, "\x7f");
   CHECK(al_ustr_get(us, 0) == 0x7f);

   us = al_ref_cstr(&info, "\xC2\x80");
   CHECK(al_ustr_get(us, 0) == 0x80);

   us = al_ref_cstr(&info, "\xDF\xBf");
   CHECK(al_ustr_get(us, 0) == 0x7ff);

   us = al_ref_cstr(&info, "\xE0\xA0\x80");
   CHECK(al_ustr_get(us, 0) == 0x800);

   us = al_ref_cstr(&info, "\xEF\xBF\xBF");
   CHECK(al_ustr_get(us, 0) == 0xffff);

   us = al_ref_cstr(&info, "\xF0\x90\x80\x80");
   CHECK(al_ustr_get(us, 0) == 0x010000);

   us = al_ref_cstr(&info, "\xF4\x8F\xBF\xBF");
   CHECK(al_ustr_get(us, 0) == 0x10ffff);
}